

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86instapi.cpp
# Opt level: O2

Error asmjit::v1_14::x86::InstInternal::validate
                (Mode mode,BaseInst *inst,Operand_ *operands,size_t opCount,
                ValidationFlags validationFlags)

{
  byte bVar1;
  uint32_t uVar2;
  BaseInst *pBVar3;
  bool bVar4;
  byte bVar5;
  uint uVar6;
  InstInfo *pIVar7;
  ulong uVar8;
  OpSignature *ref;
  uint uVar9;
  Operand_ *pOVar10;
  uint uVar11;
  InstSignature *pIVar12;
  OpSignature *op;
  size_t sVar13;
  uint uVar14;
  undefined7 in_register_00000039;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar19;
  byte bVar20;
  InstSignature *this;
  ulong uVar21;
  uint uVar22;
  bool localImmOutOfRange;
  Operand_ *local_c0;
  uint local_b4;
  ulong local_b0;
  InstSignature *local_a8;
  uint local_9c;
  ulong local_98;
  Operand_ *local_90;
  OpSignature *local_88;
  uint local_7c;
  uint local_78;
  uint local_74;
  BaseInst *local_70;
  OpSignature oSigTranslated [6];
  ulong uVar18;
  
  local_a8 = (InstSignature *)CONCAT44(local_a8._4_4_,validationFlags);
  local_b4 = (uint)CONCAT71(in_register_00000039,mode);
  local_88 = (OpSignature *)_x64ValidationData;
  if (local_b4 == 1) {
    local_88 = (OpSignature *)_x86ValidationData;
  }
  if (0x6ba < *(uint *)inst) {
    return 0x1a;
  }
  uVar22 = *(uint *)(inst + 4);
  pIVar7 = InstDB::infoById(*(uint *)inst);
  local_98 = (ulong)(*(uint *)pIVar7 >> 0xe & 0x3ff);
  local_7c = *(uint *)(InstDB::_commonInfoTable + local_98 * 8);
  if ((uVar22 & 0x32000) != 0) {
    if ((uVar22 >> 0xd & 1) == 0) {
      if ((uVar22 & 0x30000) != 0) {
        return 0x20;
      }
    }
    else {
      if ((local_7c >> 0x10 & 1) == 0) {
        if (opCount == 0) {
          return 0x21;
        }
        if ((uVar22 & 0x30000) == 0) {
          return 0x21;
        }
      }
      else if (opCount == 0) {
        return 0x21;
      }
      if (((operands->_signature)._bits & 7) != 2) {
        return 0x21;
      }
      if ((uVar22 & 0x30000) != 0) {
        if ((uVar22 & 0x30000) == 0x30000) {
          return 0x20;
        }
        if (((uVar22 >> 0x10 & 1) != 0) && ((local_7c & 0x20000) == 0)) {
          return 0x22;
        }
        if (((uVar22 >> 0x11 & 1) != 0) && ((local_7c & 0x40000) == 0)) {
          return 0x23;
        }
      }
    }
  }
  local_78 = uVar22 & 0xc000;
  if (local_78 != 0) {
    if (local_78 == 0xc000) {
      return 0x20;
    }
    if ((local_7c >> 0xe & 1) == 0) {
      return 0x24;
    }
  }
  local_74 = 0xc6;
  if ((byte)local_b4 == '\x01') {
    local_74 = 0x66;
  }
  uVar6 = 0x70c0;
  if ((byte)local_b4 == '\x01') {
    uVar6 = 0x7060;
  }
  uVar8 = 0;
  local_c0 = (Operand_ *)0x0;
  uVar14 = 0;
  uVar9 = 0;
  do {
    uVar21 = (ulong)uVar9;
    uVar17 = opCount;
    if (opCount <= uVar21) goto LAB_00140b8b;
    uVar11 = operands[uVar21]._signature._bits;
    if (5 < (uVar11 & 7)) {
LAB_00140ee1:
      return 3;
    }
    pOVar10 = operands + uVar21;
    uVar18 = 0;
    uVar17 = 0;
    switch(uVar11 & 7) {
    case 0:
      pOVar10 = operands + opCount;
      sVar13 = opCount;
      while( true ) {
        pOVar10 = pOVar10 + -1;
        sVar13 = sVar13 - 1;
        uVar17 = uVar21;
        if (sVar13 <= uVar21) break;
        if ((pOVar10->_signature)._bits != 0) {
          return 0x1a;
        }
      }
LAB_00140b8b:
      if ((byte)local_b4 == '\x01') {
        if ((uVar8 & 0x10) != 0) {
          return 0x3a;
        }
      }
      else if (((byte)(0xff < uVar14 | ((byte)inst[7] & 0x40) >> 6) == 1) && ((uVar8 & 2) != 0)) {
        return 0x39;
      }
      uVar6 = *(uint *)(InstDB::_commonInfoTable + local_98 * 8 + 4) >> 0x16 & 0x1f;
      local_b0 = opCount;
      local_9c = uVar22;
      local_90 = operands;
      local_70 = inst;
      if (uVar6 == 0) {
LAB_00140d42:
        pBVar3 = local_70;
        pOVar10 = local_90;
        if ((local_9c & 0x8c0000) != 0) {
          if ((InstDB::_commonInfoTable[local_98 * 8 + 2] & 0x80) == 0) {
            return 0x1a;
          }
          if (((local_9c >> 0x17 & 1) != 0) &&
             ((InstDB::_commonInfoTable[local_98 * 8 + 4] & 2) == 0)) {
            return 0x28;
          }
          if ((local_9c & 0xc0000) != 0) {
            if (local_c0 != (Operand_ *)0x0) {
              return 0x2a;
            }
            uVar22 = *(uint *)(InstDB::_commonInfoTable + local_98 * 8 + 4);
            if ((local_9c >> 0x12 & 1) == 0) {
              uVar6 = uVar22 & 8;
            }
            else {
              uVar6 = uVar22 & 4;
            }
            if (uVar6 == 0) {
              return 0x2a;
            }
            if ((uVar22 & 0x70) != 0) {
              if (uVar17 < 2) {
                DebugUtils::assertionFailed
                          ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/x86/x86instapi.cpp"
                           ,0x25b,"opCount >= 2");
              }
              bVar4 = x86IsZmmOrM512(local_90);
              if ((!bVar4) && (bVar4 = x86IsZmmOrM512(pOVar10 + 1), !bVar4)) {
                return 0x2a;
              }
            }
          }
        }
        uVar22 = *(uint *)(pBVar3 + 8);
        if (uVar22 == 0) {
          return 0;
        }
        if (local_78 == 0) {
          if ((uVar22 & 0xf8) != 0x88) {
            return 0x26;
          }
          if ((*(uint *)(InstDB::_commonInfoTable + local_98 * 8) & 0x800000) != 0) {
            if ((*(int *)(pBVar3 + 0xc) != 0) &&
               ((InstDB::_commonInfoTable[local_98 * 8 + 4] & 1) != 0)) {
              return 0;
            }
            return 0x27;
          }
          return 0x26;
        }
        if ((((-1 < (short)local_7c) &&
             (0xfe < *(uint *)(pBVar3 + 0xc) || *(uint *)(pBVar3 + 0xc) == 1)) &&
            (local_c0 != (Operand_ *)0x0)) &&
           (((uVar22 ^ (local_c0->_signature)._bits) & 0xf8) == 0)) {
          return 0;
        }
        return 0x26;
      }
      this = (InstSignature *)
             (InstDB::_instSignatureTable +
             (*(uint *)(InstDB::_commonInfoTable + local_98 * 8 + 4) >> 8 & 0x3ff8));
      pIVar12 = this + uVar6;
      local_b4 = local_b4 & 0xffffff03;
      bVar20 = 0;
      bVar5 = 0;
      local_b0 = uVar17;
      local_a8 = pIVar12;
      do {
        bVar1 = *(byte *)this;
        if (((byte)local_b4 & bVar1 >> 3) != 0) {
          uVar22 = bVar1 & 7;
          localImmOutOfRange = false;
          if (uVar17 == uVar22) {
            op = oSigTranslated;
            for (uVar8 = 0; pIVar12 = local_a8, (uint)uVar8 < (uint)uVar17; uVar8 = uVar8 + 1) {
              ref = InstDB::InstSignature::opSignature(this,uVar8);
              bVar4 = x86CheckOSig(op,ref,&localImmOutOfRange);
              pIVar12 = local_a8;
              if (!bVar4) break;
              op = op + 1;
            }
          }
          else {
            uVar8 = 0;
            if (uVar17 == uVar22 - (bVar1 >> 5)) {
              uVar8 = 0;
              for (sVar13 = 0;
                  (pIVar12 = local_a8, uVar17 = local_b0, uVar8 < local_b0 &&
                  ((uint)sVar13 < uVar22)); sVar13 = (size_t)((int)sVar13 + 1)) {
                local_88 = oSigTranslated + uVar8;
                while( true ) {
                  bVar5 = InstDB::InstSignature::opSignatureIndex(this,sVar13);
                  if ((InstDB::_opSignatureTable[(ulong)bVar5 * 8 + 6] & 0x80) == 0) break;
                  sVar13 = sVar13 + 1;
                  pIVar12 = local_a8;
                  uVar17 = local_b0;
                  if (uVar22 <= sVar13) goto LAB_00140d00;
                }
                bVar4 = x86CheckOSig(local_88,(OpSignature *)
                                              (InstDB::_opSignatureTable + (ulong)bVar5 * 8),
                                     &localImmOutOfRange);
                pIVar12 = local_a8;
                uVar17 = local_b0;
                if (!bVar4) break;
                uVar8 = (ulong)((int)uVar8 + 1);
              }
            }
          }
LAB_00140d00:
          bVar4 = uVar17 == (uVar8 & 0xffffffff);
          bVar5 = bVar20;
          if (bVar4) {
            bVar5 = localImmOutOfRange;
          }
          bVar20 = bVar5;
          if ((localImmOutOfRange & 1U) == 0 && bVar4) {
            if (this != pIVar12) goto LAB_00140d42;
            goto LAB_00140d2b;
          }
        }
        this = this + 1;
        if (this == pIVar12) {
LAB_00140d2b:
          if ((bVar5 & 1) == 0) {
            return 0x1a;
          }
          return 0x32;
        }
      } while( true );
    case 1:
      uVar11 = uVar11 >> 3 & 0x1f;
      if ((0xfe018f07U >> uVar11 & 1) != 0) {
        return 0x1b;
      }
      uVar15 = *(ulong *)(_x86OpFlagFromRegType + (ulong)uVar11 * 8);
      uVar19 = pOVar10->_baseId;
      if (uVar19 < 0x100) {
        if (0x1f < uVar19) {
          return 0x1d;
        }
        uVar16 = 1 << ((byte)uVar19 & 0x1f);
        uVar17 = (ulong)uVar16;
        if ((*(uint *)(&local_88->field_0x0 + (ulong)uVar11 * 4) >> (uVar19 & 0x1f) & 1) == 0) {
          return 0x1d;
        }
        uVar14 = uVar14 | uVar16;
      }
      else {
        uVar17 = 0xffffffff;
        if (((ulong)local_a8 & 1) == 0) {
          return 0x3e;
        }
      }
      break;
    case 2:
      if ((~uVar11 & 0x1c0000) == 0) {
        return 0x31;
      }
      uVar19 = uVar11 >> 0x18;
      if ((uVar11 & 0xe00000) != 0) {
        uVar16 = *(uint *)(InstDB::_commonInfoTable + local_98 * 8 + 4);
        if (uVar11 < 0x1000000) {
          uVar19 = 8;
          if ((uVar16 & 0x40) == 0) {
            uVar19 = ((uVar16 & 0x20) >> 4) + 2;
          }
        }
        else if (((uVar19 != 4) && ((uVar16 & 0x20) != 0)) ||
                ((uVar19 != 8 && ((uVar16 & 0x40) != 0)))) {
          return 0x29;
        }
        uVar19 = uVar19 << ((byte)(uVar11 >> 0x15) & 7);
      }
      bVar5 = (byte)uVar11;
      bVar20 = (byte)(uVar11 >> 8) & 0x1f;
      if (bVar5 < 8) {
        uVar2 = pOVar10->_baseId;
        if ((long)(int)pOVar10->_data[1] == CONCAT44(uVar2,pOVar10->_data[1])) {
LAB_001408e5:
          if ((uVar11 & 0x1f00) != 0) {
LAB_0014095f:
            if ((uVar6 >> (uVar11 >> 8 & 0x1f) & 1) == 0) {
              return 0x2b;
            }
            bVar20 = bVar20 - 0xc;
            if (bVar20 < 3) {
              uVar15 = *(ulong *)(&DAT_0015e880 + (ulong)bVar20 * 8);
LAB_001409a2:
              if ((bVar5 >> 3 == 2) && ((uVar15 & 0xfc0000000) != 0)) {
                return 0x2b;
              }
            }
            else {
              uVar15 = 0x8000000000000;
              if (7 < bVar5) goto LAB_001409a2;
              uVar15 = 0;
            }
            uVar11 = pOVar10->_data[0];
            if (uVar11 < 0x100) {
              if (0x1f < uVar11) {
                return 0x1d;
              }
              uVar14 = uVar14 | 1 << (uVar11 & 0x1f);
              uVar17 = 0;
            }
            else {
              uVar17 = 0;
              if (((ulong)local_a8 & 1) == 0) {
                return 0x3e;
              }
            }
            goto LAB_00140a2b;
          }
        }
        else {
          if ((byte)local_b4 == '\x01') {
            if (uVar2 != 0) {
              return 0x2e;
            }
            goto LAB_001408e5;
          }
          if ((uVar11 & 0x1f00) != 0) {
            if (uVar2 != 0) {
              return 0x2e;
            }
            if (bVar20 != 6) {
              return 0x2f;
            }
            goto LAB_0014095f;
          }
        }
        uVar15 = 0;
        uVar17 = 0;
      }
      else {
        if (bVar5 < 0x10) goto LAB_001408e5;
        uVar16 = pOVar10->_baseId;
        if (((uVar11 >> 0xd & 1) == 0) && ((local_74 >> (bVar5 >> 3) & 1) == 0)) {
          return 0x2b;
        }
        if (uVar16 < 0x100) {
          if (0x1f < uVar16) {
            return 0x1d;
          }
          uVar17 = (ulong)(uint)(1 << ((byte)uVar16 & 0x1f));
          uVar14 = uVar14 | 1 << (uVar16 & 0x1f);
        }
        else {
          uVar17 = 0xffffffff;
          if (((ulong)local_a8 & 1) == 0) {
            return 0x3e;
          }
        }
        if ((uVar11 & 0x1f00) != 0) goto LAB_0014095f;
        uVar15 = (ulong)(pOVar10->_data[1] == 0) << 0x30;
      }
LAB_00140a2b:
      local_c0 = pOVar10;
      switch(uVar19) {
      case 0:
        uVar15 = uVar15 | 0x40000;
        break;
      case 1:
        uVar15 = uVar15 | 0x80000;
        break;
      case 2:
        uVar15 = uVar15 | 0x100000;
        break;
      case 3:
      case 5:
      case 7:
      case 9:
      case 0xb:
      case 0xc:
      case 0xd:
      case 0xe:
      case 0xf:
        return 0x33;
      case 4:
        uVar15 = uVar15 | 0x200000;
        break;
      case 6:
        uVar15 = uVar15 | 0x400000;
        break;
      case 8:
        uVar15 = uVar15 | 0x800000;
        break;
      case 10:
        uVar15 = uVar15 | 0x1000000;
        break;
      case 0x10:
        uVar15 = uVar15 | 0x2000000;
        break;
      default:
        if (uVar19 == 0x20) {
          uVar15 = uVar15 | 0x4000000;
        }
        else {
          if (uVar19 != 0x40) {
            return 0x33;
          }
          uVar15 = uVar15 | 0x8000000;
        }
      }
      break;
    case 3:
      goto LAB_00140ee1;
    case 4:
      uVar15 = *(ulong *)pOVar10->_data;
      if ((long)((ulong)pOVar10->_data[1] << 0x20) < 0) {
        uVar15 = -uVar15;
        if (uVar15 < 9) {
          uVar15 = 0x155000000000;
        }
        else if (uVar15 < 0x81) {
          uVar15 = 0x154000000000;
        }
        else if (uVar15 < 0x8001) {
          uVar15 = 0x150000000000;
        }
        else {
          uVar15 = ((ulong)(uVar15 < 0x80000001) | 4) << 0x2a;
        }
      }
      else if (uVar15 < 8) {
        uVar15 = 0x3ff000000000;
        uVar17 = uVar18;
      }
      else if (uVar15 < 0x10) {
        uVar15 = 0x3fe000000000;
        uVar17 = uVar18;
      }
      else if (uVar15 < 0x80) {
        uVar15 = 0x3fc000000000;
      }
      else if (uVar15 < 0x100) {
        uVar15 = 0x3f8000000000;
      }
      else if (uVar15 < 0x8000) {
        uVar15 = 0x3f0000000000;
      }
      else if (uVar15 < 0x10000) {
        uVar15 = 0x3e0000000000;
      }
      else if (uVar15 < 0x80000000) {
        uVar15 = 0x3c0000000000;
      }
      else {
        uVar15 = ((ulong)(pOVar10->_data[1] == 0) | 6) << 0x2b;
      }
      break;
    case 5:
      uVar15 = 0xc00000000000;
      uVar17 = uVar18;
    }
    oSigTranslated[uVar21] = (OpSignature)(uVar17 << 0x38 | uVar15 & 0xffffffffffffff);
    uVar8 = uVar8 | uVar15;
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

static ASMJIT_FAVOR_SIZE Error validate(InstDB::Mode mode, const BaseInst& inst, const Operand_* operands, size_t opCount, ValidationFlags validationFlags) noexcept {
  uint32_t i;

  // Get the instruction data.
  const X86ValidationData* vd = (mode == InstDB::Mode::kX86) ? &_x86ValidationData : &_x64ValidationData;
  InstId instId = inst.id();
  InstOptions options = inst.options();

  if (ASMJIT_UNLIKELY(!Inst::isDefinedId(instId)))
    return DebugUtils::errored(kErrorInvalidInstruction);

  const InstDB::InstInfo& instInfo = InstDB::infoById(instId);
  const InstDB::CommonInfo& commonInfo = instInfo.commonInfo();

  InstDB::InstFlags iFlags = instInfo.flags();

  constexpr InstOptions kRepAny = InstOptions::kX86_Rep | InstOptions::kX86_Repne;
  constexpr InstOptions kXAcqXRel = InstOptions::kX86_XAcquire | InstOptions::kX86_XRelease;
  constexpr InstOptions kAvx512Options = InstOptions::kX86_ZMask | InstOptions::kX86_ER | InstOptions::kX86_SAE;

  // Validate LOCK|XACQUIRE|XRELEASE Prefixes
  // ----------------------------------------

  if (Support::test(options, InstOptions::kX86_Lock | kXAcqXRel)) {
    if (Support::test(options, InstOptions::kX86_Lock)) {
      if (ASMJIT_UNLIKELY(!Support::test(iFlags, InstDB::InstFlags::kLock) && !Support::test(options, kXAcqXRel)))
        return DebugUtils::errored(kErrorInvalidLockPrefix);

      if (ASMJIT_UNLIKELY(opCount < 1 || !operands[0].isMem()))
        return DebugUtils::errored(kErrorInvalidLockPrefix);
    }

    if (Support::test(options, kXAcqXRel)) {
      if (ASMJIT_UNLIKELY(!Support::test(options, InstOptions::kX86_Lock) || (options & kXAcqXRel) == kXAcqXRel))
        return DebugUtils::errored(kErrorInvalidPrefixCombination);

      if (ASMJIT_UNLIKELY(Support::test(options, InstOptions::kX86_XAcquire) && !Support::test(iFlags, InstDB::InstFlags::kXAcquire)))
        return DebugUtils::errored(kErrorInvalidXAcquirePrefix);

      if (ASMJIT_UNLIKELY(Support::test(options, InstOptions::kX86_XRelease) && !Support::test(iFlags, InstDB::InstFlags::kXRelease)))
        return DebugUtils::errored(kErrorInvalidXReleasePrefix);
    }
  }

  // Validate REP and REPNE Prefixes
  // -------------------------------

  if (Support::test(options, kRepAny)) {
    if (ASMJIT_UNLIKELY((options & kRepAny) == kRepAny))
      return DebugUtils::errored(kErrorInvalidPrefixCombination);

    if (ASMJIT_UNLIKELY(!Support::test(iFlags, InstDB::InstFlags::kRep)))
      return DebugUtils::errored(kErrorInvalidRepPrefix);
  }

  // Translate Each Operand to the Corresponding OpSignature
  // -------------------------------------------------------

  InstDB::OpSignature oSigTranslated[Globals::kMaxOpCount];
  InstDB::OpFlags combinedOpFlags = InstDB::OpFlags::kNone;
  uint32_t combinedRegMask = 0;
  const Mem* memOp = nullptr;

  for (i = 0; i < opCount; i++) {
    const Operand_& op = operands[i];
    if (op.opType() == OperandType::kNone)
      break;

    InstDB::OpFlags opFlags = InstDB::OpFlags::kNone;
    RegMask regMask = 0;

    switch (op.opType()) {
      case OperandType::kReg: {
        RegType regType = op.as<BaseReg>().type();
        opFlags = _x86OpFlagFromRegType[size_t(regType)];

        if (ASMJIT_UNLIKELY(opFlags == InstDB::OpFlags::kNone))
          return DebugUtils::errored(kErrorInvalidRegType);

        // If `regId` is equal or greater than Operand::kVirtIdMin it means that the register is virtual and its
        // index will be assigned later by the register allocator. We must pass unless asked to disallow virtual
        // registers.
        uint32_t regId = op.id();
        if (regId < Operand::kVirtIdMin) {
          if (ASMJIT_UNLIKELY(regId >= 32))
            return DebugUtils::errored(kErrorInvalidPhysId);

          if (ASMJIT_UNLIKELY(Support::bitTest(vd->allowedRegMask[size_t(regType)], regId) == 0))
            return DebugUtils::errored(kErrorInvalidPhysId);

          regMask = Support::bitMask(regId);
          combinedRegMask |= regMask;
        }
        else {
          if (uint32_t(validationFlags & ValidationFlags::kEnableVirtRegs) == 0)
            return DebugUtils::errored(kErrorIllegalVirtReg);
          regMask = 0xFFFFFFFFu;
        }
        break;
      }

      // TODO: Validate base and index and combine these with `combinedRegMask`.
      case OperandType::kMem: {
        const Mem& m = op.as<Mem>();
        memOp = &m;

        uint32_t memSize = m.size();
        RegType baseType = m.baseType();
        RegType indexType = m.indexType();

        if (m.segmentId() > 6)
          return DebugUtils::errored(kErrorInvalidSegment);

        // Validate AVX-512 broadcast {1tox}.
        if (m.hasBroadcast()) {
          if (memSize != 0) {
            // If the size is specified it has to match the broadcast size.
            if (ASMJIT_UNLIKELY(commonInfo.hasAvx512B32() && memSize != 4))
              return DebugUtils::errored(kErrorInvalidBroadcast);

            if (ASMJIT_UNLIKELY(commonInfo.hasAvx512B64() && memSize != 8))
              return DebugUtils::errored(kErrorInvalidBroadcast);
          }
          else {
            // If there is no size we implicitly calculate it so we can validate N in {1toN} properly.
            memSize = commonInfo.hasAvx512B64() ? 8 :
                      commonInfo.hasAvx512B32() ? 4 : 2;
          }

          memSize <<= uint32_t(m.getBroadcast());
        }

        if (baseType != RegType::kNone && baseType > RegType::kLabelTag) {
          uint32_t baseId = m.baseId();

          if (m.isRegHome()) {
            // Home address of a virtual register. In such case we don't want to validate the type of the
            // base register as it will always be patched to ESP|RSP.
          }
          else {
            if (ASMJIT_UNLIKELY(!Support::bitTest(vd->allowedMemBaseRegs, baseType)))
              return DebugUtils::errored(kErrorInvalidAddress);
          }

          // Create information that will be validated only if this is an implicit memory operand. Basically
          // only usable for string instructions and other instructions where memory operand is implicit and
          // has 'seg:[reg]' form.
          if (baseId < Operand::kVirtIdMin) {
            if (ASMJIT_UNLIKELY(baseId >= 32))
              return DebugUtils::errored(kErrorInvalidPhysId);

            // Physical base id.
            regMask = Support::bitMask(baseId);
            combinedRegMask |= regMask;
          }
          else {
            // Virtual base id - fill the whole mask for implicit mem validation. The register is not assigned
            // yet, so we cannot predict the phys id.
            if (uint32_t(validationFlags & ValidationFlags::kEnableVirtRegs) == 0)
              return DebugUtils::errored(kErrorIllegalVirtReg);
            regMask = 0xFFFFFFFFu;
          }

          if (indexType == RegType::kNone && !m.offsetLo32())
            opFlags |= InstDB::OpFlags::kFlagMemBase;
        }
        else if (baseType == RegType::kLabelTag) {
          // [Label] - there is no need to validate the base as it's label.
        }
        else {
          // Base is a 64-bit address.
          int64_t offset = m.offset();
          if (!Support::isInt32(offset)) {
            if (mode == InstDB::Mode::kX86) {
              // 32-bit mode: Make sure that the address is either `int32_t` or `uint32_t`.
              if (!Support::isUInt32(offset))
                return DebugUtils::errored(kErrorInvalidAddress64Bit);
            }
            else {
              // 64-bit mode: Zero extension is allowed if the address has 32-bit index register or the address
              // has no index register (it's still encodable).
              if (indexType != RegType::kNone) {
                if (!Support::isUInt32(offset))
                  return DebugUtils::errored(kErrorInvalidAddress64Bit);

                if (indexType != RegType::kX86_Gpd)
                  return DebugUtils::errored(kErrorInvalidAddress64BitZeroExtension);
              }
              else {
                // We don't validate absolute 64-bit addresses without an index register as this also depends
                // on the target's base address. We don't have the information to do it at this moment.
              }
            }
          }
        }

        if (indexType != RegType::kNone) {
          if (ASMJIT_UNLIKELY(!Support::bitTest(vd->allowedMemIndexRegs, indexType)))
            return DebugUtils::errored(kErrorInvalidAddress);

          if (indexType == RegType::kX86_Xmm) {
            opFlags |= InstDB::OpFlags::kVm32x | InstDB::OpFlags::kVm64x;
          }
          else if (indexType == RegType::kX86_Ymm) {
            opFlags |= InstDB::OpFlags::kVm32y | InstDB::OpFlags::kVm64y;
          }
          else if (indexType == RegType::kX86_Zmm) {
            opFlags |= InstDB::OpFlags::kVm32z | InstDB::OpFlags::kVm64z;
          }
          else {
            if (baseType != RegType::kNone)
              opFlags |= InstDB::OpFlags::kFlagMib;
          }

          // [RIP + {XMM|YMM|ZMM}] is not allowed.
          if (baseType == RegType::kX86_Rip && Support::test(opFlags, InstDB::OpFlags::kVmMask))
            return DebugUtils::errored(kErrorInvalidAddress);

          uint32_t indexId = m.indexId();
          if (indexId < Operand::kVirtIdMin) {
            if (ASMJIT_UNLIKELY(indexId >= 32))
              return DebugUtils::errored(kErrorInvalidPhysId);

            combinedRegMask |= Support::bitMask(indexId);
          }
          else {
            if (uint32_t(validationFlags & ValidationFlags::kEnableVirtRegs) == 0)
              return DebugUtils::errored(kErrorIllegalVirtReg);
          }

          // Only used for implicit memory operands having 'seg:[reg]' form, so clear it.
          regMask = 0;
        }

        switch (memSize) {
          case  0: opFlags |= InstDB::OpFlags::kMemUnspecified; break;
          case  1: opFlags |= InstDB::OpFlags::kMem8; break;
          case  2: opFlags |= InstDB::OpFlags::kMem16; break;
          case  4: opFlags |= InstDB::OpFlags::kMem32; break;
          case  6: opFlags |= InstDB::OpFlags::kMem48; break;
          case  8: opFlags |= InstDB::OpFlags::kMem64; break;
          case 10: opFlags |= InstDB::OpFlags::kMem80; break;
          case 16: opFlags |= InstDB::OpFlags::kMem128; break;
          case 32: opFlags |= InstDB::OpFlags::kMem256; break;
          case 64: opFlags |= InstDB::OpFlags::kMem512; break;

          default:
            return DebugUtils::errored(kErrorInvalidOperandSize);
        }

        break;
      }

      case OperandType::kImm: {
        uint64_t immValue = op.as<Imm>().valueAs<uint64_t>();

        if (int64_t(immValue) >= 0) {
          if (immValue <= 0x7u)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32 |
                      InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmU16 | InstDB::OpFlags::kImmI8  | InstDB::OpFlags::kImmU8  |
                      InstDB::OpFlags::kImmI4  | InstDB::OpFlags::kImmU4  ;
          else if (immValue <= 0xFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32 |
                      InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmU16 | InstDB::OpFlags::kImmI8  | InstDB::OpFlags::kImmU8  |
                      InstDB::OpFlags::kImmU4  ;
          else if (immValue <= 0x7Fu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32 |
                      InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmU16 | InstDB::OpFlags::kImmI8  | InstDB::OpFlags::kImmU8  ;
          else if (immValue <= 0xFFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32 |
                      InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmU16 | InstDB::OpFlags::kImmU8  ;
          else if (immValue <= 0x7FFFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32 |
                      InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmU16 ;
          else if (immValue <= 0xFFFFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32 |
                      InstDB::OpFlags::kImmU16 ;
          else if (immValue <= 0x7FFFFFFFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32;
          else if (immValue <= 0xFFFFFFFFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmU32;
          else if (immValue <= 0x7FFFFFFFFFFFFFFFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64;
          else
            opFlags = InstDB::OpFlags::kImmU64;
        }
        else {
          immValue = Support::neg(immValue);
          if (immValue <= 0x8u)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmI8 | InstDB::OpFlags::kImmI4;
          else if (immValue <= 0x80u)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmI8;
          else if (immValue <= 0x8000u)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmI16;
          else if (immValue <= 0x80000000u)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmI32;
          else
            opFlags = InstDB::OpFlags::kImmI64;
        }
        break;
      }

      case OperandType::kLabel: {
        opFlags |= InstDB::OpFlags::kRel8 | InstDB::OpFlags::kRel32;
        break;
      }

      default:
        return DebugUtils::errored(kErrorInvalidState);
    }

    InstDB::OpSignature& oSigDst = oSigTranslated[i];
    oSigDst._flags = uint64_t(opFlags) & 0x00FFFFFFFFFFFFFFu;
    oSigDst._regMask = uint8_t(regMask & 0xFFu);
    combinedOpFlags |= opFlags;
  }

  // Decrease the number of operands of those that are none. This is important as Assembler and Compiler may just pass
  // more operands padded with none (which means that no operand is given at that index). However, validate that there
  // are no gaps (like [reg, none, reg] or [none, reg]).
  if (i < opCount) {
    while (--opCount > i)
      if (ASMJIT_UNLIKELY(!operands[opCount].isNone()))
        return DebugUtils::errored(kErrorInvalidInstruction);
  }

  // Validate X86 and X64 specific cases.
  if (mode == InstDB::Mode::kX86) {
    // Illegal use of 64-bit register in 32-bit mode.
    if (ASMJIT_UNLIKELY(Support::test(combinedOpFlags, InstDB::OpFlags::kRegGpq)))
      return DebugUtils::errored(kErrorInvalidUseOfGpq);
  }
  else {
    // Illegal use of a high 8-bit register with REX prefix.
    bool hasREX = inst.hasOption(InstOptions::kX86_Rex) || (combinedRegMask & 0xFFFFFF00u) != 0;
    if (ASMJIT_UNLIKELY(hasREX && Support::test(combinedOpFlags, InstDB::OpFlags::kRegGpbHi)))
      return DebugUtils::errored(kErrorInvalidUseOfGpbHi);
  }

  // Validate Instruction Signature by Comparing Against All `iSig` Rows
  // -------------------------------------------------------------------

  const InstDB::InstSignature* iSig = InstDB::_instSignatureTable + commonInfo._iSignatureIndex;
  const InstDB::InstSignature* iEnd = iSig + commonInfo._iSignatureCount;

  if (iSig != iEnd) {
    const InstDB::OpSignature* opSignatureTable = InstDB::_opSignatureTable;

    // If set it means that we matched a signature where only immediate value
    // was out of bounds. We can return a more descriptive error if we know this.
    bool globalImmOutOfRange = false;

    do {
      // Check if the architecture is compatible.
      if (!iSig->supportsMode(mode))
        continue;

      // Compare the operands table with reference operands.
      uint32_t j = 0;
      uint32_t iSigCount = iSig->opCount();
      bool localImmOutOfRange = false;

      if (iSigCount == opCount) {
        for (j = 0; j < opCount; j++)
          if (!x86CheckOSig(oSigTranslated[j], iSig->opSignature(j), localImmOutOfRange))
            break;
      }
      else if (iSigCount - iSig->implicitOpCount() == opCount) {
        uint32_t r = 0;
        for (j = 0; j < opCount && r < iSigCount; j++, r++) {
          const InstDB::OpSignature* oChk = oSigTranslated + j;
          const InstDB::OpSignature* oRef;
Next:
          oRef = opSignatureTable + iSig->opSignatureIndex(r);
          // Skip implicit operands.
          if (oRef->isImplicit()) {
            if (++r >= iSigCount)
              break;
            else
              goto Next;
          }

          if (!x86CheckOSig(*oChk, *oRef, localImmOutOfRange))
            break;
        }
      }

      if (j == opCount) {
        if (!localImmOutOfRange) {
          // Match, must clear possible `globalImmOutOfRange`.
          globalImmOutOfRange = false;
          break;
        }
        globalImmOutOfRange = localImmOutOfRange;
      }
    } while (++iSig != iEnd);

    if (iSig == iEnd) {
      if (globalImmOutOfRange)
        return DebugUtils::errored(kErrorInvalidImmediate);
      else
        return DebugUtils::errored(kErrorInvalidInstruction);
    }
  }

  // Validate AVX512 Options
  // -----------------------

  const RegOnly& extraReg = inst.extraReg();

  if (Support::test(options, kAvx512Options)) {
    if (commonInfo.hasFlag(InstDB::InstFlags::kEvex)) {
      // Validate AVX-512 {z}.
      if (Support::test(options, InstOptions::kX86_ZMask)) {
        if (ASMJIT_UNLIKELY(Support::test(options, InstOptions::kX86_ZMask) && !commonInfo.hasAvx512Z()))
          return DebugUtils::errored(kErrorInvalidKZeroUse);
      }

      // Validate AVX-512 {sae} and {er}.
      if (Support::test(options, InstOptions::kX86_SAE | InstOptions::kX86_ER)) {
        // Rounding control is impossible if the instruction is not reg-to-reg.
        if (ASMJIT_UNLIKELY(memOp))
          return DebugUtils::errored(kErrorInvalidEROrSAE);

        // Check if {sae} or {er} is supported by the instruction.
        if (Support::test(options, InstOptions::kX86_ER)) {
          // NOTE: if both {sae} and {er} are set, we don't care, as {sae} is implied.
          if (ASMJIT_UNLIKELY(!commonInfo.hasAvx512ER()))
            return DebugUtils::errored(kErrorInvalidEROrSAE);
        }
        else {
          if (ASMJIT_UNLIKELY(!commonInfo.hasAvx512SAE()))
            return DebugUtils::errored(kErrorInvalidEROrSAE);
        }

        // {sae} and {er} are defined for either scalar ops or vector ops that require LL to be 10 (512-bit vector
        // operations). We don't need any more bits in the instruction database to be able to validate this, as
        // each AVX512 instruction that has broadcast is vector instruction (in this case we require zmm registers),
        // otherwise it's a scalar instruction, which is valid.
        if (commonInfo.hasAvx512B()) {
          // Supports broadcast, thus we require LL to be '10', which means there have to be ZMM registers used. We
          // don't calculate LL here, but we know that it would be '10' if there is at least one ZMM register used.

          // There is no {er}/{sae}-enabled instruction with less than two operands.
          ASMJIT_ASSERT(opCount >= 2);
          if (ASMJIT_UNLIKELY(!x86IsZmmOrM512(operands[0]) && !x86IsZmmOrM512(operands[1])))
            return DebugUtils::errored(kErrorInvalidEROrSAE);
        }
      }
    }
    else {
      // Not an AVX512 instruction - maybe OpExtra is xCX register used by REP/REPNE prefix.
      if (Support::test(options, kAvx512Options) || !Support::test(options, kRepAny))
        return DebugUtils::errored(kErrorInvalidInstruction);
    }
  }

  // Validate {Extra} Register
  // -------------------------

  if (extraReg.isReg()) {
    if (Support::test(options, kRepAny)) {
      // Validate REP|REPNE {cx|ecx|rcx}.
      if (ASMJIT_UNLIKELY(Support::test(iFlags, InstDB::InstFlags::kRepIgnored)))
        return DebugUtils::errored(kErrorInvalidExtraReg);

      if (extraReg.isPhysReg()) {
        if (ASMJIT_UNLIKELY(extraReg.id() != Gp::kIdCx))
          return DebugUtils::errored(kErrorInvalidExtraReg);
      }

      // The type of the {...} register must match the type of the base register
      // of memory operand. So if the memory operand uses 32-bit register the
      // count register must also be 32-bit, etc...
      if (ASMJIT_UNLIKELY(!memOp || extraReg.type() != memOp->baseType()))
        return DebugUtils::errored(kErrorInvalidExtraReg);
    }
    else if (commonInfo.hasFlag(InstDB::InstFlags::kEvex)) {
      // Validate AVX-512 {k}.
      if (ASMJIT_UNLIKELY(extraReg.type() != RegType::kX86_KReg))
        return DebugUtils::errored(kErrorInvalidExtraReg);

      if (ASMJIT_UNLIKELY(extraReg.id() == 0 || !commonInfo.hasAvx512K()))
        return DebugUtils::errored(kErrorInvalidKMaskUse);
    }
    else {
      return DebugUtils::errored(kErrorInvalidExtraReg);
    }
  }

  return kErrorOk;
}